

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Taload<double>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  double_t val;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  val = READ<double>(this,iVar2 + iVar1 * 2);
  PUSH<double>(this,val);
  return;
}

Assistant:

void VM::Taload() {
    addr_t addr = slots_count<T> * POP<addr_t>();
    addr += POP<addr_t>();
    PUSH(READ<T>(addr));
}